

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

value_type * __thiscall QList<QByteArray>::takeFirst(QList<QByteArray> *this)

{
  QArrayDataPointer<QByteArray> *in_RSI;
  QList<QByteArray> *in_RDI;
  value_type *v;
  QByteArray *in_stack_ffffffffffffffc8;
  
  (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QByteArray *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).size = -0x5555555555555556;
  first(in_RDI);
  QByteArray::QByteArray((QByteArray *)in_RDI,in_stack_ffffffffffffffc8);
  QArrayDataPointer<QByteArray>::operator->(in_RSI);
  QtPrivate::QGenericArrayOps<QByteArray>::eraseFirst((QGenericArrayOps<QByteArray> *)in_RDI);
  return (value_type *)in_RDI;
}

Assistant:

value_type takeFirst() { Q_ASSERT(!isEmpty()); value_type v = std::move(first()); d->eraseFirst(); return v; }